

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

void mcpl_generic_fwseek(mcpl_generic_wfilehandle_t *fh,uint64_t position)

{
  int iVar1;
  
  if (position == 0xffffffffffffffff) {
    iVar1 = fseek((FILE *)fh->internal,0,2);
    position = ftell((FILE *)fh->internal);
  }
  else {
    iVar1 = fseek((FILE *)fh->internal,position,0);
  }
  fh->current_pos = position;
  if (iVar1 == 0) {
    return;
  }
  (*mcpl_error_handler)("Error while seeking in output file");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

void mcpl_generic_fwseek( mcpl_generic_wfilehandle_t* fh,
                          uint64_t position )
{
  int rv;
  if ( position == UINT64_MAX ) {
    rv = MCPL_FSEEK_END( (FILE*)(fh->internal) );
    fh->current_pos = (uint64_t)MCPL_FTELL((FILE*)(fh->internal));
  } else {
    rv = MCPL_FSEEK( (FILE*)(fh->internal), position );
    fh->current_pos = position;
  }
  if ( rv != 0 )
    mcpl_error("Error while seeking in output file");
}